

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O0

void ggml_dyn_tallocr_reset(ggml_dyn_tallocr *alloc)

{
  ggml_dyn_tallocr *alloc_local;
  
  alloc->n_free_blocks = 1;
  alloc->free_blocks[0].offset = 0;
  alloc->free_blocks[0].size = 0x7fffffffffffffff;
  alloc->max_size = 0;
  return;
}

Assistant:

static void ggml_dyn_tallocr_reset(struct ggml_dyn_tallocr * alloc) {
    alloc->n_free_blocks = 1;
    alloc->free_blocks[0].offset = 0;
    alloc->free_blocks[0].size = SIZE_MAX/2; // restrict maximum size of a measure allocator to half size_t max to avoid overflows
    alloc->max_size = 0;

#ifdef GGML_ALLOCATOR_DEBUG
    for (int i = 0; i < 1024; i++) {
        alloc->allocated_tensors[i].tensor = NULL;
    }
#endif
}